

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

cf_bool_t cf_array_reserve(cf_array_t *self,int count)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (int)self->capacity;
  if ((-1 < count) && (bVar1 = iVar2 < count, iVar2 = count, bVar1)) {
    return 0;
  }
  self->elm_count = (long)iVar2;
  cf_membzero(self->elm_start,(long)iVar2 * self->elm_size);
  return 1;
}

Assistant:

cf_bool_t cf_array_reserve(cf_array_t* self, int count) {
    if (count < 0) {
        count = self->capacity;
    }
    if (count > (int)self->capacity) {
        return CF_FALSE;
    }
    self->elm_count = count;
    cf_membzero(self->elm_start, self->elm_size * count);
    return CF_TRUE;
}